

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

bool __thiscall
clickhouse::Client::Impl::ReceiveData(Impl *this,function<void_(const_clickhouse::Block_&)> *cb)

{
  CodedInputStream *input;
  bool bVar1;
  Impl *pIVar2;
  CodedInputStream coded;
  Block block;
  string table_name;
  CompressedInput compressed;
  undefined1 local_b0 [48];
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  CompressedInput local_60;
  
  Block::Block((Block *)(local_b0 + 8));
  local_80._0_8_ = &local_70;
  local_80._8_8_ = 0;
  local_70._M_local_buf[0] = '\0';
  input = &this->input_;
  pIVar2 = (Impl *)input;
  bVar1 = WireFormat::ReadString(input,(string *)local_80);
  if (bVar1) {
    if (this->compression_ == 1) {
      CompressedInput::CompressedInput(&local_60,input);
      pIVar2 = (Impl *)local_b0;
      CodedInputStream::CodedInputStream((CodedInputStream *)pIVar2,&local_60.super_ZeroCopyInput);
      bVar1 = ReadBlock(pIVar2,(Block *)(local_b0 + 8),(CodedInputStream *)local_b0);
      CompressedInput::~CompressedInput(&local_60);
      if (bVar1) {
LAB_00165237:
        bVar1 = true;
        std::function<void_(const_clickhouse::Block_&)>::operator()(cb,(Block *)(local_b0 + 8));
        goto LAB_00165247;
      }
    }
    else {
      bVar1 = ReadBlock(pIVar2,(Block *)(local_b0 + 8),input);
      if (bVar1) goto LAB_00165237;
    }
  }
  bVar1 = false;
LAB_00165247:
  std::__cxx11::string::~string((string *)local_80);
  Block::~Block((Block *)(local_b0 + 8));
  return bVar1;
}

Assistant:

bool Client::Impl::ReceiveData(std::function<void(const Block&)> cb) {
    Block block;
    std::string table_name;

    // Read name of a table.
    if (!WireFormat::ReadString(&input_, &table_name)) {
        return false;
    }

    if (compression_ == CompressionState::Enable) {
        CompressedInput compressed(&input_);
        CodedInputStream coded(&compressed);

        if (!ReadBlock(&block, &coded)) {
            return false;
        }
    } else {
        if (!ReadBlock(&block, &input_)) {
            return false;
        }
    }

    cb(block);

    return true;
}